

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

void __thiscall Args::HelpPrinter::print(HelpPrinter *this,OutStreamType *to)

{
  anon_class_24_3_e40bd48b __f;
  bool bVar1;
  uint uVar2;
  Arguments *leftMargin;
  Arguments *rightMargin;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  ostream *poVar7;
  ulong uVar8;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_RSI;
  size_type in_RDI;
  type printArg;
  StringList usage_1;
  function<void_(Args::ArgIface_*)> createUsageAndAppend;
  bool requiredFlag;
  StringList usage;
  type f;
  bool requiredAllOfGroup;
  size_type maxCommand;
  size_type maxName;
  size_type maxFlag;
  vector<Args::Command_*,_std::allocator<Args::Command_*>_> commands;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> optional;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> required;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *in_stack_fffffffffffffa08;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *this_00;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *this_01;
  __normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
  __last;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  __last_00;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  __first;
  HelpPrinter **in_stack_fffffffffffffa30;
  reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  *in_stack_fffffffffffffa38;
  reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
  *in_stack_fffffffffffffa40;
  _Placeholder<1> *in_stack_fffffffffffffa48;
  HelpPrinter **in_stack_fffffffffffffa50;
  offset_in_HelpPrinter_to_subr *in_stack_fffffffffffffa58;
  reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  *in_stack_fffffffffffffa80;
  reference_wrapper<unsigned_long> *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  HelpPrinter *in_stack_fffffffffffffa98;
  bool *in_stack_fffffffffffffaa0;
  StringList *words;
  OutStreamType *to_00;
  HelpPrinter *this_02;
  unsigned_long *local_110;
  undefined1 local_108 [16];
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *local_f8;
  _Head_base<7UL,_std::reference_wrapper<unsigned_long>,_false> local_f0;
  _Head_base<6UL,_std::reference_wrapper<unsigned_long>,_false> local_e8;
  code *local_d8;
  _Head_base<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  local_d0;
  undefined1 local_71 [9];
  long local_68;
  undefined1 local_60 [32];
  undefined1 local_40 [48];
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *local_10;
  
  to_00 = (OutStreamType *)(local_40 + 0x18);
  local_10 = in_RSI;
  std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::vector
            ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)0x125c8c);
  this_02 = (HelpPrinter *)local_40;
  std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::vector
            ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)0x125ca1);
  words = (StringList *)(local_60 + 8);
  std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::vector
            ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)0x125cb6);
  local_60._0_8_ = (pointer)0x0;
  local_68 = 0;
  local_71._1_8_ = 0;
  local_71[0] = (Deleter<Args::ArgIface>)0x0;
  local_d8 = sortArg;
  local_d0._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       (vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)0x0;
  local_e8._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)
       std::ref<std::vector<Args::Command*,std::allocator<Args::Command*>>>
                 ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)
                  in_stack_fffffffffffffa08);
  local_f0._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)
       std::ref<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>
                 (in_stack_fffffffffffffa08);
  local_f8 = (vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
             std::ref<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>
                       (in_stack_fffffffffffffa08);
  local_108._8_8_ = std::ref<unsigned_long>((unsigned_long *)in_stack_fffffffffffffa08);
  local_108._0_8_ = std::ref<unsigned_long>((unsigned_long *)in_stack_fffffffffffffa08);
  local_110 = (unsigned_long *)std::ref<unsigned_long>((unsigned_long *)in_stack_fffffffffffffa08);
  __first._M_current =
       (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)local_71;
  __last_00._M_current =
       (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)&local_110;
  __last._M_current = (Command **)local_108;
  this_00 = (vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             *)&local_f8;
  std::
  bind<void(Args::HelpPrinter::*)(std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const&,std::vector<Args::Command*,std::allocator<Args::Command*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,unsigned_long&,unsigned_long&,unsigned_long&,bool)const,Args::HelpPrinter*,std::_Placeholder<1>const&,std::reference_wrapper<std::vector<Args::Command*,std::allocator<Args::Command*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,bool&>
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa80,
             in_stack_fffffffffffffa88,
             (reference_wrapper<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             (reference_wrapper<unsigned_long> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffaa0
            );
  leftMargin = CmdLine::arguments(*(CmdLine **)(in_RDI + 0x48));
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cbegin(this_00);
  rightMargin = CmdLine::arguments(*(CmdLine **)(in_RDI + 0x48));
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cend(this_00);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::vector<Args::Command*,std::allocator<Args::Command*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,bool))(std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const&,std::vector<Args::Command*,std::allocator<Args::Command*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,unsigned_long&,unsigned_long&,unsigned_long&,bool)const>>
            (__first,__last_00,
             (_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
              *)__last._M_current);
  iVar3 = std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::begin
                    ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)this_00);
  iVar4 = std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::end
                    ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)this_00);
  std::
  sort<__gnu_cxx::__normal_iterator<Args::ArgIface**,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar3._M_current,iVar4._M_current);
  iVar3 = std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::begin
                    ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)this_00);
  iVar4 = std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::end
                    ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)this_00);
  std::
  sort<__gnu_cxx::__normal_iterator<Args::ArgIface**,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_2_>
            (iVar3._M_current,iVar4._M_current);
  iVar5 = std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::begin
                    ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)this_00);
  iVar6 = std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::end
                    ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)this_00);
  std::
  sort<__gnu_cxx::__normal_iterator<Args::Command**,std::vector<Args::Command*,std::allocator<Args::Command*>>>,Args::HelpPrinter::print(std::ostream&)::_lambda(auto:1_const&,auto:2_const&)_3_>
            (iVar5._M_current,iVar6._M_current);
  local_60._0_8_ = local_60._0_8_ + 2;
  local_68 = local_68 + 2;
  local_71._1_8_ = local_71._1_8_ + 2;
  splitToWords(in_stack_fffffffffffffa98,
               (String *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  printString(this_02,to_00,words,in_RDI,(size_type)leftMargin,(size_type)rightMargin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__last_00._M_current);
  poVar7 = std::operator<<((ostream *)local_10,"\n");
  std::operator<<(poVar7,"\n");
  bVar1 = std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::empty
                    ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)
                     __last_00._M_current);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1260b4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__last_00._M_current,(value_type *)__last._M_current);
    std::function<void(Args::ArgIface*)>::
    function<Args::HelpPrinter::print(std::ostream&)::_lambda(Args::ArgIface*)_1_,void>
              ((function<void_(Args::ArgIface_*)> *)__last_00._M_current,
               (anon_class_24_3_7b4f0bdb *)__last._M_current);
    std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cbegin
              ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)this_00);
    std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cend
              ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)this_00);
    std::function<void_(Args::ArgIface_*)>::function
              ((function<void_(Args::ArgIface_*)> *)__last_00._M_current,
               (function<void_(Args::ArgIface_*)> *)__last._M_current);
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::function<void(Args::ArgIface*)>>
              ((__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )__first._M_current,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )__last_00._M_current,(function<void_(Args::ArgIface_*)> *)__last._M_current);
    std::function<void_(Args::ArgIface_*)>::~function((function<void_(Args::ArgIface_*)> *)0x12619b)
    ;
    std::function<void_(Args::ArgIface_*)>::~function((function<void_(Args::ArgIface_*)> *)0x1261a8)
    ;
    std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cbegin
              ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)this_00);
    std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cend
              ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)this_00);
    std::function<void_(Args::ArgIface_*)>::function
              ((function<void_(Args::ArgIface_*)> *)__last_00._M_current,
               (function<void_(Args::ArgIface_*)> *)__last._M_current);
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::function<void(Args::ArgIface*)>>
              ((__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )__first._M_current,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )__last_00._M_current,(function<void_(Args::ArgIface_*)> *)__last._M_current);
    std::function<void_(Args::ArgIface_*)>::~function((function<void_(Args::ArgIface_*)> *)0x12622d)
    ;
    std::function<void_(Args::ArgIface_*)>::~function((function<void_(Args::ArgIface_*)> *)0x12623a)
    ;
    std::operator<<((ostream *)local_10,"USAGE: ");
    uVar2 = CmdLine::parserOptions(*(CmdLine **)(in_RDI + 0x48));
    if ((uVar2 & 2) != 0) {
      CmdLine::positionalDescription_abi_cxx11_(*(CmdLine **)(in_RDI + 0x48));
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        CmdLine::positionalDescription_abi_cxx11_(*(CmdLine **)(in_RDI + 0x48));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__last_00._M_current,(value_type *)__last._M_current);
    }
    printString(this_02,to_00,words,in_RDI,(size_type)leftMargin,(size_type)rightMargin);
    poVar7 = std::operator<<((ostream *)local_10,"\n");
    std::operator<<(poVar7,"\n");
    std::function<void_(Args::ArgIface_*)>::~function((function<void_(Args::ArgIface_*)> *)0x126431)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__last_00._M_current);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x126477);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__last_00._M_current,(value_type *)__last._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__last_00._M_current,(value_type *)__last._M_current);
    bVar1 = std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::empty
                      ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                       __last_00._M_current);
    if ((!bVar1) ||
       (bVar1 = std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::empty
                          ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                           __last_00._M_current), !bVar1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__last_00._M_current,(value_type *)__last._M_current);
    }
    uVar2 = CmdLine::parserOptions(*(CmdLine **)(in_RDI + 0x48));
    if ((uVar2 & 2) != 0) {
      CmdLine::positionalDescription_abi_cxx11_(*(CmdLine **)(in_RDI + 0x48));
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        CmdLine::positionalDescription_abi_cxx11_(*(CmdLine **)(in_RDI + 0x48));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__last_00._M_current,(value_type *)__last._M_current);
    }
    std::operator<<((ostream *)local_10,"USAGE: ");
    printString(this_02,to_00,words,in_RDI,(size_type)leftMargin,(size_type)rightMargin);
    poVar7 = std::operator<<((ostream *)local_10,"\n");
    std::operator<<(poVar7,"\n");
    std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::cbegin
              ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)this_00);
    std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::cend
              ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)this_00);
    __last._M_current = (Command **)(local_71 + 1);
    __f.this = (HelpPrinter *)in_stack_fffffffffffffa38;
    __f.to = (OutStreamType *)in_stack_fffffffffffffa30;
    __f.maxCommand = (size_type *)in_stack_fffffffffffffa40;
    this_00 = local_10;
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::Command*const*,std::vector<Args::Command*,std::allocator<Args::Command*>>>,Args::HelpPrinter::print(std::ostream&)::_lambda(Args::Command*)_1_>
              ((__normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                )__last_00._M_current,__last,__f);
    std::operator<<((ostream *)local_10,"\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__last_00._M_current);
  }
  std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)this_00);
  this_01 = (vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)local_60;
  std::
  bind<void(Args::HelpPrinter::*)(Args::ArgIface*,std::ostream&,unsigned_long,unsigned_long)const,Args::HelpPrinter*,std::_Placeholder<1>const&,std::reference_wrapper<std::ostream>,unsigned_long,unsigned_long&>
            ((offset_in_HelpPrinter_to_subr *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
             (_Placeholder<1> *)__first._M_current,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)
             __last_00._M_current,(unsigned_long *)__last._M_current,
             (unsigned_long *)in_stack_fffffffffffffa50);
  bVar1 = std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::empty
                    ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                     __last_00._M_current);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)local_10,"REQUIRED:");
    std::operator<<(poVar7,"\n");
    std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cbegin(this_01);
    std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cend(this_01);
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::ostream>,unsigned_long,unsigned_long))(Args::ArgIface*,std::ostream&,unsigned_long,unsigned_long)const>>
              ((__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )__first._M_current,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )__last_00._M_current,
               (_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
                *)__last._M_current);
  }
  bVar1 = std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::empty
                    ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)
                     __last_00._M_current);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)local_10,"OPTIONAL:");
    std::operator<<(poVar7,"\n");
    std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cbegin(this_01);
    std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::cend(this_01);
    std::
    for_each<__gnu_cxx::__normal_iterator<Args::ArgIface*const*,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter*,std::_Placeholder<1>,std::reference_wrapper<std::ostream>,unsigned_long,unsigned_long))(Args::ArgIface*,std::ostream&,unsigned_long,unsigned_long)const>>
              ((__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )__first._M_current,
               (__normal_iterator<Args::ArgIface_*const_*,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                )__last_00._M_current,
               (_Bind<void_(Args::HelpPrinter::*(Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_unsigned_long,_unsigned_long))(Args::ArgIface_*,_std::basic_ostream<char,_std::char_traits<char>_>_&,_unsigned_long,_unsigned_long)_const>
                *)__last._M_current);
  }
  std::ostream::flush();
  std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::~vector
            ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)__last_00._M_current);
  std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::~vector
            ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)__last_00._M_current);
  std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::~vector
            ((vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)__last_00._M_current);
  return;
}

Assistant:

inline void
HelpPrinter::print( OutStreamType & to )
{
	std::vector< ArgIface* > required;
	std::vector< ArgIface* > optional;
	std::vector< Command* > commands;

	String::size_type maxFlag = 0;
	String::size_type maxName = 0;
	String::size_type maxCommand = 0;

	bool requiredAllOfGroup = false;

	auto f = std::bind( &HelpPrinter::sortArg, this, std::placeholders::_1,
		std::ref( commands ), std::ref( required ),
		std::ref( optional ), std::ref( maxFlag ),
		std::ref( maxName ), std::ref( maxCommand ),
		requiredAllOfGroup );

	std::for_each( m_cmdLine->arguments().cbegin(),
		m_cmdLine->arguments().cend(), f );

	// Sort arguments by name.
	std::sort( required.begin(), required.end(),
		[] ( const auto & a1, const auto & a2 )
			{ return details::argNameLess( a1, a2 ); } );

	std::sort( optional.begin(), optional.end(),
		[] ( const auto & a1, const auto & a2 )
			{ return details::argNameLess( a1, a2 ); } );

	std::sort( commands.begin(), commands.end(),
		[] ( const auto & c1, const auto & c2 )
			{ return details::argNameLess( c1, c2 ); } );

	maxFlag += 2;
	maxName += 2;
	maxCommand += 2;

	printString( to, splitToWords( m_appDescription ), 0, 0, 0 );

	to << "\n" << "\n";

	if( commands.empty() )
	{
		StringList usage;

		usage.push_back( m_exeName );

		bool requiredFlag = true;

		std::function< void ( ArgIface* ) > createUsageAndAppend =
			[ & ] ( ArgIface * arg )
			{
				const StringList words = createUsageString( arg,
					requiredFlag );

				for( const auto & w : details::asConst( words ) )
					usage.push_back( w );
			};

		std::for_each( required.cbegin(), required.cend(),
			createUsageAndAppend );

		requiredFlag = false;

		std::for_each( optional.cbegin(), optional.cend(),
			createUsageAndAppend );

		to << "USAGE: ";

		if( m_cmdLine->parserOptions() & CmdLine::HandlePositionalArguments )
			usage.push_back( m_cmdLine->positionalDescription().empty() ? c_positional :
				m_cmdLine->positionalDescription() );

		printString( to, usage, 7, 7, 1 );

		to << "\n" << "\n";
	}
	else
	{
		StringList usage;

		usage.push_back( m_exeName );
		usage.push_back( c_commands );

		if( !optional.empty() || !required.empty() )
			usage.push_back( c_options );

		if( m_cmdLine->parserOptions() & CmdLine::HandlePositionalArguments )
			usage.push_back( m_cmdLine->positionalDescription().empty() ? c_positional :
				m_cmdLine->positionalDescription() );

		to << "USAGE: ";

		printString( to, usage, 7, 7, 1 );

		to << "\n" << "\n";

		std::for_each( commands.cbegin(), commands.cend(),
			[ & ] ( Command * cmd )
			{
				String::size_type pos = 2;

				to << "  " << cmd->name();

				pos += cmd->name().length();

				if( cmd->isWithValue() )
				{
					to << " <" << cmd->valueSpecifier() << ">";

					pos += 3 + cmd->valueSpecifier().length();
				}

				printString( to, splitToWords( cmd->description() ), pos,
					maxCommand + 1, 0 );

				to << "\n";
			} );

		to << "\n";
	}

	auto printArg = std::bind( &HelpPrinter::printOnlyFor, this,
		std::placeholders::_1, std::ref( to ),
			( maxFlag == 1 ? maxName + 6 : ( maxName + 6 > maxFlag + 1 ?
				maxName + 6 : maxFlag + 1 ) ),
		maxFlag );

	if( !required.empty() )
	{
		to << "REQUIRED:" << "\n";

		std::for_each( required.cbegin(), required.cend(), printArg );
	}

	if( !optional.empty() )
	{
		to << "OPTIONAL:" << "\n";

		std::for_each( optional.cbegin(), optional.cend(), printArg );
	}

	to.flush();
}